

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2pnet.cpp
# Opt level: O0

void draw_result(Mat *bgr,vector<CrowdPoint,_std::allocator<CrowdPoint>_> *crowd_points)

{
  _InputOutputArray *this;
  _InputOutputArray *p_Var1;
  const_reference pvVar2;
  vector<CrowdPoint,_std::allocator<CrowdPoint>_> *in_RSI;
  int i;
  float threshold;
  Mat image;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  _InputArray *in_stack_fffffffffffffee0;
  Mat *in_stack_fffffffffffffee8;
  allocator *paVar3;
  double in_stack_fffffffffffffef8;
  Scalar_<double> *in_stack_ffffffffffffff00;
  allocator local_e9;
  string local_e8 [32];
  undefined1 local_c8 [36];
  Point_<int> local_a4 [2];
  undefined1 local_90 [24];
  int local_78;
  undefined4 local_74;
  Mat local_70 [96];
  vector<CrowdPoint,_std::allocator<CrowdPoint>_> *local_10;
  
  local_10 = in_RSI;
  cv::Mat::clone();
  local_74 = 0x3f000000;
  local_78 = 0;
  while( true ) {
    this = (_InputOutputArray *)(long)local_78;
    p_Var1 = (_InputOutputArray *)
             std::vector<CrowdPoint,_std::allocator<CrowdPoint>_>::size(local_10);
    if (p_Var1 <= this) break;
    pvVar2 = std::vector<CrowdPoint,_std::allocator<CrowdPoint>_>::operator[]
                       (local_10,(long)local_78);
    if (0.5 < pvVar2->prob) {
      cv::_InputOutputArray::_InputOutputArray(this,in_stack_fffffffffffffee8);
      pvVar2 = std::vector<CrowdPoint,_std::allocator<CrowdPoint>_>::operator[]
                         (local_10,(long)local_78);
      cv::Point_<int>::Point_(local_a4,&pvVar2->pt);
      cv::Scalar_<double>::Scalar_
                (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(double)this,
                 (double)in_stack_fffffffffffffee8,(double)in_stack_fffffffffffffee0);
      in_stack_fffffffffffffed8 = 0;
      cv::circle(local_90,local_a4,4,local_c8,0xffffffff,8);
      cv::_InputOutputArray::~_InputOutputArray((_InputOutputArray *)0x1440cc);
    }
    local_78 = local_78 + 1;
  }
  paVar3 = &local_e9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"image",paVar3);
  cv::_InputArray::_InputArray
            (in_stack_fffffffffffffee0,
             (Mat *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  cv::imshow(local_e8,(_InputArray *)&stack0xfffffffffffffef8);
  cv::_InputArray::~_InputArray((_InputArray *)&stack0xfffffffffffffef8);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  cv::waitKey(0);
  cv::Mat::~Mat(local_70);
  return;
}

Assistant:

static void draw_result(const cv::Mat& bgr, const std::vector<CrowdPoint>& crowd_points)
{
    cv::Mat image = bgr.clone();
    const float threshold = 0.5f;
    for (int i = 0; i < crowd_points.size(); i++)
    {
        if (crowd_points[i].prob > threshold)
        {
            cv::circle(image, crowd_points[i].pt, 4, cv::Scalar(0, 0, 255), -1, 8, 0);
        }
    }
    cv::imshow("image", image);
    cv::waitKey();
}